

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QStyleOptionGraphicsItem>::relocate
          (QArrayDataPointer<QStyleOptionGraphicsItem> *this,qsizetype offset,
          QStyleOptionGraphicsItem **data)

{
  bool bVar1;
  long n;
  QStyleOptionGraphicsItem *in_RDX;
  long in_RSI;
  QStyleOptionGraphicsItem *in_RDI;
  QStyleOptionGraphicsItem **unaff_retaddr;
  QStyleOptionGraphicsItem *res;
  QStyleOptionGraphicsItem *c;
  
  n = *(long *)&(in_RDI->super_QStyleOption).state + in_RSI * 0x60;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QStyleOptionGraphicsItem,long_long>(in_RDX,n,in_RDI);
  if ((in_RDX != (QStyleOptionGraphicsItem *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QStyleOptionGraphicsItem>,QStyleOptionGraphicsItem_const*>
                        (unaff_retaddr,(QArrayDataPointer<QStyleOptionGraphicsItem> *)c), bVar1)) {
    *(long *)&in_RDX->super_QStyleOption = in_RSI * 0x60 + *(long *)&in_RDX->super_QStyleOption;
  }
  (in_RDI->super_QStyleOption).state = (State)(int)n;
  (in_RDI->super_QStyleOption).direction = (int)((ulong)n >> 0x20);
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }